

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFirmwareGetConsoleLogs(zes_firmware_handle_t hFirmware,size_t *pSize,char *pFirmwareLog)

{
  zes_pfnFirmwareGetConsoleLogs_t pfnGetConsoleLogs;
  ze_result_t result;
  char *pFirmwareLog_local;
  size_t *pSize_local;
  zes_firmware_handle_t hFirmware_local;
  
  pfnGetConsoleLogs._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cce0 != (code *)0x0) {
    pfnGetConsoleLogs._4_4_ = (*DAT_0011cce0)(hFirmware,pSize,pFirmwareLog);
  }
  return pfnGetConsoleLogs._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFirmwareGetConsoleLogs(
        zes_firmware_handle_t hFirmware,                ///< [in] Handle for the component.
        size_t* pSize,                                  ///< [in,out] size of firmware log
        char* pFirmwareLog                              ///< [in,out][optional] pointer to null-terminated string of the log.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetConsoleLogs = context.zesDdiTable.Firmware.pfnGetConsoleLogs;
        if( nullptr != pfnGetConsoleLogs )
        {
            result = pfnGetConsoleLogs( hFirmware, pSize, pFirmwareLog );
        }
        else
        {
            // generic implementation
        }

        return result;
    }